

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVset_attr_list_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  CManager_conflict cm_00;
  undefined8 uVar1;
  CManager in_RDX;
  attr_list list;
  CMFormat f;
  EVset_attr_list_request *request;
  EV_void_response response;
  FMStructDescList in_stack_ffffffffffffffb8;
  CManager_conflict in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  
  cm_00 = (CManager_conflict)CMlookup_format(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (cm_00 == (CManager_conflict)0x0) {
    cm_00 = (CManager_conflict)INT_CMregister_format(in_RDX,(FMStructDescList)0x0);
  }
  uVar1._0_4_ = in_RDX->initialized;
  uVar1._4_4_ = in_RDX->reference_count;
  uVar1 = attr_list_from_string(uVar1);
  EVset_attr_list(cm_00,(EVstone)((ulong)uVar1 >> 0x20),(attr_list)0x1585f9);
  free_attr_list(uVar1);
  CMwrite((CMConnection)CONCAT44(*(undefined4 *)&in_RDX->transports,in_stack_ffffffffffffffd0),
          (CMFormat)in_RDX,cm_00);
  return;
}

Assistant:

static void
REVset_attr_list_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_void_response response;
    EVset_attr_list_request *request = (EVset_attr_list_request *) data;
    CMFormat f = CMlookup_format(conn->cm, EV_void_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_void_response_formats);
    }
    attr_list list = attr_list_from_string(request->list);
    EVset_attr_list(cm, request->stone_id, list);
free_attr_list(list);
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}